

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

Vec_Int_t * Dtt_ManCollect(Dtt_Man_t *p,uint Truth,Vec_Int_t *vFuns)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  word Truth_00;
  uint Truth_01;
  long lVar3;
  long lVar4;
  
  vFuns->nSize = 0;
  Truth_00 = (ulong)Truth * 0x100000001;
  for (lVar4 = 0; lVar4 < p->nPerms; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 < p->nComps; lVar3 = lVar3 + 1) {
      Truth_01 = -(uint)((p->CmpMask & (uint)Truth_00) != 0) ^ (uint)Truth_00;
      iVar1 = Dtt_ManCheckHash(p,Truth_01);
      if (iVar1 != 0) {
        Vec_IntPush(vFuns,Truth_01);
      }
      Truth_00 = Abc_Tt6Flip(Truth_00,p->pComps[lVar3]);
    }
    Truth_00 = Abc_Tt6SwapAdjacent(Truth_00,p->pPerms[lVar4]);
  }
  if (Truth_00 == (ulong)Truth * 0x100000001) {
    for (iVar1 = 0; p_00 = p->vUsedBins, iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar1);
      p->pBins[iVar2] = 0xffffffff;
    }
    p_00->nSize = 0;
    return vFuns;
  }
  __assert_fail("tCur == (((word)Truth << 32) | (word)Truth)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                ,0x1fc,"Vec_Int_t *Dtt_ManCollect(Dtt_Man_t *, unsigned int, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Dtt_ManCollect( Dtt_Man_t * p, unsigned Truth, Vec_Int_t * vFuns )
{
    int i, k, Entry;
    word tCur = ((word)Truth << 32) | (word)Truth;
    Vec_IntClear( vFuns );
    for ( i = 0; i < p->nPerms; i++ )
    {
        for ( k = 0; k < p->nComps; k++ )
        {
//            unsigned tTemp = (unsigned)(tCur & 1 ? ~tCur : tCur);
            unsigned tTemp = (unsigned)(tCur & p->CmpMask ? ~tCur : tCur);
            if ( Dtt_ManCheckHash( p, tTemp ) )
                Vec_IntPush( vFuns, tTemp );
            tCur = Abc_Tt6Flip( tCur, p->pComps[k] );
        }
        tCur = Abc_Tt6SwapAdjacent( tCur, p->pPerms[i] );
    }
    assert( tCur == (((word)Truth << 32) | (word)Truth) );
    // clean hash table
    Vec_IntForEachEntry( p->vUsedBins, Entry, i )
        p->pBins[Entry] = ~0;
    Vec_IntClear( p->vUsedBins );
    //printf( "%d ", Vec_IntSize(vFuns) );
    return vFuns;
}